

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadMeshLodInfo(OgreBinarySerializer *this,Mesh *mesh)

{
  uchar uVar1;
  uchar uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  uint uVar5;
  size_t sVar6;
  runtime_error *prVar7;
  ulong uVar8;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  Mesh *local_78;
  string local_70;
  string local_50;
  
  local_78 = mesh;
  ReadLine_abi_cxx11_(&local_50,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  uVar3 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  uVar1 = StreamReader<false,_false>::Get<unsigned_char>(this->m_reader);
  if (1 < uVar3) {
    uVar8 = 1;
    do {
      uVar4 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
      uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
      this->m_currentLen = uVar5;
      if (uVar4 != 0x8100) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_98,
                   "M_MESH_LOD does not contain a M_MESH_LOD_USAGE for each LOD level","");
        std::runtime_error::runtime_error(prVar7,(string *)local_98);
        *(undefined ***)prVar7 = &PTR__runtime_error_007dd738;
        __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      StreamReader<false,_false>::IncPtr(this->m_reader,4);
      if (uVar1 == '\0') {
        for (sVar6 = Ogre::Mesh::NumSubMeshes(local_78); sVar6 != 0; sVar6 = sVar6 - 1) {
          uVar4 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
          uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          this->m_currentLen = uVar5;
          if (uVar4 != 0x8120) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_98[0] = local_88;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_98,
                       "Generated M_MESH_LOD_USAGE does not contain M_MESH_LOD_GENERATED","");
            std::runtime_error::runtime_error(prVar7,(string *)local_98);
            *(undefined ***)prVar7 = &PTR__runtime_error_007dd738;
            __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          uVar2 = StreamReader<false,_false>::Get<unsigned_char>(this->m_reader);
          if (uVar5 != 0) {
            StreamReader<false,_false>::IncPtr
                      (this->m_reader,(ulong)(uVar5 << (2U - (uVar2 == '\0') & 0x1f)));
          }
        }
      }
      else {
        uVar4 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
        uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
        this->m_currentLen = uVar5;
        if (uVar4 != 0x8110) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_98[0] = local_88;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"Manual M_MESH_LOD_USAGE does not contain M_MESH_LOD_MANUAL"
                     ,"");
          std::runtime_error::runtime_error(prVar7,(string *)local_98);
          *(undefined ***)prVar7 = &PTR__runtime_error_007dd738;
          __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        ReadLine_abi_cxx11_(&local_70,this);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar3);
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadMeshLodInfo(Mesh *mesh)
{
    // Assimp does not acknowledge LOD levels as far as I can see it. This info is just skipped.
    // @todo Put this stuff to scene/mesh custom properties. If manual mesh the app can use the information.
    ReadLine(); // strategy name
    uint16_t numLods = Read<uint16_t>();
    bool manual = Read<bool>();

    /// @note Main mesh is considered as LOD 0, start from index 1.
    for (size_t i=1; i<numLods; ++i)
    {
        uint16_t id = ReadHeader();
        if (id != M_MESH_LOD_USAGE) {
            throw DeadlyImportError("M_MESH_LOD does not contain a M_MESH_LOD_USAGE for each LOD level");
        }

        m_reader->IncPtr(sizeof(float)); // user value

        if (manual)
        {
            id = ReadHeader();
            if (id != M_MESH_LOD_MANUAL) {
                throw DeadlyImportError("Manual M_MESH_LOD_USAGE does not contain M_MESH_LOD_MANUAL");
            }

            ReadLine(); // manual mesh name (ref to another mesh)
        }
        else
        {
            for(size_t si=0, silen=mesh->NumSubMeshes(); si<silen; ++si)
            {
                id = ReadHeader();
                if (id != M_MESH_LOD_GENERATED) {
                    throw DeadlyImportError("Generated M_MESH_LOD_USAGE does not contain M_MESH_LOD_GENERATED");
                }

                uint32_t indexCount = Read<uint32_t>();
                bool is32bit = Read<bool>();

                if (indexCount > 0)
                {
                    uint32_t len = indexCount * (is32bit ? sizeof(uint32_t) : sizeof(uint16_t));
                    m_reader->IncPtr(len);
                }
            }
        }
    }
}